

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.h
# Opt level: O2

void __thiscall adios2::query::QueryComposite::Print(QueryComposite *this)

{
  pointer ppQVar1;
  ostream *poVar2;
  pointer ppQVar3;
  
  poVar2 = std::operator<<((ostream *)&std::cout," Composite query");
  std::endl<char,std::char_traits<char>>(poVar2);
  ppQVar1 = (this->m_Nodes).
            super__Vector_base<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppQVar3 = (this->m_Nodes).
                 super__Vector_base<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppQVar3 != ppQVar1;
      ppQVar3 = ppQVar3 + 1) {
    (*(*ppQVar3)->_vptr_QueryBase[3])();
  }
  return;
}

Assistant:

void Print()
    {
        std::cout << " Composite query" << std::endl;
        for (auto n : m_Nodes)
            n->Print();
    }